

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::checkValidHere(Forth *this,char *name)

{
  uint uVar1;
  char *__s;
  CAddr CVar2;
  reference pvVar3;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *name_local;
  Forth *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  CVar2 = getDataPointer(this);
  pvVar3 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::operator[](&this->VirtualMemory,2);
  if (pvVar3->start <= CVar2) {
    pvVar3 = std::
             vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
             ::operator[](&this->VirtualMemory,2);
    uVar1 = pvVar3->end;
    CVar2 = getDataPointer(this);
    if (CVar2 < uVar1) {
      return;
    }
  }
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,__s,&local_79);
  std::operator+(&local_58,&local_78,": HERE outside data space ");
  CVar2 = getDataPointer(this);
  std::__cxx11::to_string(&local_b0,CVar2);
  std::operator+(&local_38,&local_58,&local_b0);
  throwCppExceptionMessage(this,&local_38,errorInvalidAddress);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void checkValidHere(const char* name) {
			RUNTIME_ERROR_IF(getDataPointer() < VirtualMemory[vmSegmentDataSpace].start || 
				VirtualMemory[vmSegmentDataSpace].end <= getDataPointer(),
				std::string(name) + ": HERE outside data space "+std::to_string(getDataPointer()),errorInvalidAddress);
		}